

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_celsius.cc
# Opt level: O0

void __thiscall hwtest::pgraph::MthdCelsiusTexControlA::emulate_mthd(MthdCelsiusTexControlA *this)

{
  sbyte sVar1;
  sbyte sVar2;
  MthdCelsiusTexControlA *this_local;
  
  pgraph_celsius_pre_icmd(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp);
  if (-1 < (long)((ulong)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource <<
                 0x3e)) {
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_tex_control_a
    [*(int *)&(this->super_SingleMthdTest).super_MthdTest.field_0x25914] =
         (this->super_SingleMthdTest).super_MthdTest.val & 0x7fffffff;
    sVar1 = 0;
    if (*(int *)&(this->super_SingleMthdTest).super_MthdTest.field_0x25914 != 0) {
      sVar1 = 0xe;
    }
    sVar2 = 0;
    if (*(int *)&(this->super_SingleMthdTest).super_MthdTest.field_0x25914 != 0) {
      sVar2 = 0xe;
    }
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_xf_misc_b =
         (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_xf_misc_b &
         ((uint)(1L << sVar1) ^ 0xffffffff) |
         (uint)((((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x21) >> 0x3f) << sVar2)
    ;
    pgraph_celsius_icmd(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,
                        *(int *)&(this->super_SingleMthdTest).super_MthdTest.field_0x25914 + 6,
                        (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.
                        bundle_tex_control_a
                        [*(int *)&(this->super_SingleMthdTest).super_MthdTest.field_0x25914],true);
    if (-1 < (long)((ulong)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.debug_d
                   << 0x23)) {
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_pipe_junk[2] =
           (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_xf_misc_a;
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_pipe_junk[3] =
           (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_xf_misc_b;
    }
  }
  return;
}

Assistant:

void emulate_mthd() override {
		pgraph_celsius_pre_icmd(&exp);
		if (!extr(exp.nsource, 1, 1)) {
			exp.bundle_tex_control_a[idx] = val & 0x7fffffff;
			insrt(exp.celsius_xf_misc_b, idx ? 14 : 0, 1, extr(val, 30, 1));
			pgraph_celsius_icmd(&exp, 6 + idx, exp.bundle_tex_control_a[idx], true);
			if (!extr(exp.debug_d, 28, 1)) {
				exp.celsius_pipe_junk[2] = exp.celsius_xf_misc_a;
				exp.celsius_pipe_junk[3] = exp.celsius_xf_misc_b;
			}
		}
	}